

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  float *pfVar7;
  void *pvVar8;
  float *pfVar9;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int q;
  int iVar17;
  void *pvVar18;
  long lVar19;
  int p;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  void *pvVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  Mat bottom_blob_int8;
  Option opt_g;
  
  uVar12 = (long)this->weight_data_size / (long)this->num_output;
  iVar15 = bottom_blob->w;
  uVar14 = bottom_blob->h;
  uVar2 = bottom_blob->c;
  uVar21 = (ulong)uVar2;
  sVar4 = bottom_blob->elemsize;
  ncnn::Mat::Mat(&bottom_blob_int8,bottom_blob);
  if (sVar4 != 1) {
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator = opt->workspace_allocator;
    opt_g.openmp_blocktime = opt->openmp_blocktime;
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.use_vulkan_compute = opt->use_vulkan_compute;
    uVar20._0_1_ = opt->use_bf16_storage;
    uVar20._1_1_ = opt->use_fp16_packed;
    uVar20._2_1_ = opt->use_fp16_storage;
    uVar20._3_1_ = opt->use_fp16_arithmetic;
    uVar20._4_1_ = opt->use_int8_packed;
    uVar20._5_1_ = opt->use_int8_storage;
    uVar20._6_1_ = opt->use_int8_arithmetic;
    uVar20._7_1_ = opt->use_packing_layout;
    opt_g.use_shader_pack8 = opt->use_shader_pack8;
    opt_g.use_subgroup_basic = opt->use_subgroup_basic;
    opt_g.use_subgroup_vote = opt->use_subgroup_vote;
    opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_g.use_image_storage = opt->use_image_storage;
    opt_g.use_tensor_storage = opt->use_tensor_storage;
    opt_g.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_g.flush_denormals = opt->flush_denormals;
    opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_g.use_reserved_1 = opt->use_reserved_1;
    opt_g.use_reserved_2 = opt->use_reserved_2;
    opt_g.use_reserved_3 = opt->use_reserved_3;
    opt_g.use_reserved_4 = opt->use_reserved_4;
    opt_g.use_reserved_5 = opt->use_reserved_5;
    opt_g.use_reserved_6 = opt->use_reserved_6;
    opt_g.use_reserved_7 = opt->use_reserved_7;
    opt_g.use_reserved_8 = opt->use_reserved_8;
    opt_g.use_reserved_9 = opt->use_reserved_9;
    opt_g.use_reserved_10 = opt->use_reserved_10;
    opt_g.use_reserved_11 = opt->use_reserved_11;
    opt_g.blob_allocator = opt->workspace_allocator;
    opt_g._32_8_ = uVar20 & 0xffffffffffffff;
    quantize_to_int8(bottom_blob,&bottom_blob_int8,&this->bottom_blob_int8_scales,&opt_g);
  }
  iVar17 = (int)uVar12;
  if ((bottom_blob->dims == 2) && (1 < (int)uVar14 && iVar15 == iVar17)) {
    ncnn::Mat::create(top_blob,this->num_output,uVar14,4,opt->blob_allocator);
    pvVar5 = top_blob->data;
    iVar22 = -100;
    if ((pvVar5 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_001b69aa;
    iVar15 = top_blob->w;
    sVar4 = top_blob->elemsize;
    uVar21 = 0;
    if (0 < iVar17) {
      uVar21 = uVar12 & 0xffffffff;
    }
    uVar2 = this->num_output;
    if (this->num_output < 1) {
      uVar2 = 0;
    }
    pvVar23 = bottom_blob_int8.data;
    for (uVar12 = 0; uVar12 != uVar14; uVar12 = uVar12 + 1) {
      pvVar18 = (this->weight_data).data;
      pvVar6 = (this->weight_data_int8_scales).data;
      pfVar7 = (float *)(this->bottom_blob_int8_scales).data;
      iVar22 = this->bias_term;
      iVar3 = this->activation_type;
      pvVar8 = (this->bias_data).data;
      pfVar9 = (float *)(this->activation_params).data;
      for (uVar20 = 0; uVar20 != uVar2; uVar20 = uVar20 + 1) {
        iVar11 = 0;
        for (uVar13 = 0; uVar21 != uVar13; uVar13 = uVar13 + 1) {
          iVar11 = iVar11 + (int)*(char *)((long)pvVar18 + uVar13) *
                            (int)*(char *)((long)pvVar23 + uVar13);
        }
        fVar26 = *(float *)((long)pvVar6 + uVar20 * 4);
        fVar25 = 0.0;
        if (fVar26 != 0.0) {
          fVar25 = 1.0 / (fVar26 * *pfVar7);
        }
        fVar25 = (float)iVar11 * fVar25;
        if (iVar22 != 0) {
          fVar25 = fVar25 + *(float *)((long)pvVar8 + uVar20 * 4);
        }
        fVar26 = fVar25;
        switch(iVar3) {
        case 1:
          if (fVar25 <= 0.0) {
            fVar26 = 0.0;
          }
          break;
        case 2:
          fVar26 = (float)(~-(uint)(0.0 < fVar25) & (uint)*pfVar9 |
                          -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
          break;
        case 3:
          if (fVar25 <= *pfVar9) {
            fVar25 = *pfVar9;
          }
          fVar26 = fVar25;
          if (pfVar9[1] <= fVar25) {
            fVar26 = pfVar9[1];
          }
          break;
        case 4:
          fVar26 = expf(-fVar25);
          fVar26 = 1.0 / (fVar26 + 1.0);
          break;
        case 5:
          fVar26 = expf(fVar25);
          fVar26 = logf(fVar26 + 1.0);
          fVar26 = tanhf(fVar26);
          fVar26 = fVar26 * fVar25;
          break;
        case 6:
          fVar1 = *pfVar9;
          fVar27 = -pfVar9[1] / fVar1;
          fVar26 = 0.0;
          if ((fVar27 <= fVar25) && (fVar26 = fVar25, fVar25 <= fVar27 + 1.0 / fVar1)) {
            fVar26 = (fVar1 * fVar25 + pfVar9[1]) * fVar25;
          }
        }
        *(float *)((long)pvVar5 + uVar20 * 4 + (long)iVar15 * sVar4 * uVar12) = fVar26;
        pvVar18 = (void *)((long)pvVar18 + (long)iVar17);
      }
      pvVar23 = (void *)((long)pvVar23 + (long)bottom_blob_int8.w * bottom_blob_int8.elemsize);
    }
  }
  else {
    ncnn::Mat::create(top_blob,this->num_output,4,opt->blob_allocator);
    iVar22 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_001b69aa;
    uVar14 = uVar14 * iVar15;
    uVar12 = 0;
    if (0 < (int)uVar14) {
      uVar12 = (ulong)uVar14;
    }
    if ((int)uVar2 < 1) {
      uVar21 = 0;
    }
    lVar16 = 0;
    for (lVar19 = 0; lVar19 < this->num_output; lVar19 = lVar19 + 1) {
      pvVar5 = top_blob->data;
      iVar15 = 0;
      lVar24 = lVar16;
      for (uVar20 = 0; uVar20 != uVar21; uVar20 = uVar20 + 1) {
        pvVar23 = (this->weight_data).data;
        ncnn::Mat::channel((Mat *)&opt_g,&bottom_blob_int8,(int)uVar20);
        uVar10 = opt_g._0_8_;
        ncnn::Mat::~Mat((Mat *)&opt_g);
        for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
          iVar15 = iVar15 + (int)*(char *)((long)pvVar23 + uVar13 + lVar24) *
                            (int)*(char *)(uVar10 + uVar13);
        }
        lVar24 = lVar24 + (int)uVar14;
      }
      fVar26 = *(float *)((long)(this->weight_data_int8_scales).data + lVar19 * 4);
      fVar25 = 0.0;
      if (fVar26 != 0.0) {
        fVar25 = 1.0 / (fVar26 * *(this->bottom_blob_int8_scales).data);
      }
      fVar25 = (float)iVar15 * fVar25;
      if (this->bias_term != 0) {
        fVar25 = fVar25 + *(float *)((long)(this->bias_data).data + lVar19 * 4);
      }
      fVar26 = fVar25;
      switch(this->activation_type) {
      case 1:
        if (fVar25 <= 0.0) {
          fVar26 = 0.0;
        }
        break;
      case 2:
        fVar26 = (float)(~-(uint)(0.0 < fVar25) & *(this->activation_params).data |
                        -(uint)(0.0 < fVar25) & 0x3f800000) * fVar25;
        break;
      case 3:
        pfVar7 = (float *)(this->activation_params).data;
        fVar26 = *pfVar7;
        if (fVar25 <= fVar26) {
          fVar25 = fVar26;
        }
        fVar1 = pfVar7[1];
        fVar26 = fVar25;
        if (fVar1 <= fVar25) {
          fVar26 = fVar1;
        }
        break;
      case 4:
        fVar26 = expf(-fVar25);
        fVar26 = 1.0 / (fVar26 + 1.0);
        break;
      case 5:
        fVar26 = expf(fVar25);
        fVar26 = logf(fVar26 + 1.0);
        fVar26 = tanhf(fVar26);
        fVar26 = fVar26 * fVar25;
        break;
      case 6:
        pfVar7 = (float *)(this->activation_params).data;
        fVar1 = *pfVar7;
        fVar27 = pfVar7[1];
        fVar28 = -fVar27 / fVar1;
        fVar26 = 0.0;
        if ((fVar28 <= fVar25) && (fVar26 = fVar25, fVar25 <= fVar28 + 1.0 / fVar1)) {
          fVar26 = (fVar1 * fVar25 + fVar27) * fVar25;
        }
      }
      *(float *)((long)pvVar5 + lVar19 * 4) = fVar26;
      lVar16 = lVar16 + (int)(uVar14 * uVar2);
    }
  }
  iVar22 = 0;
LAB_001b69aa:
  ncnn::Mat::~Mat(&bottom_blob_int8);
  return iVar22;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}